

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_error.cpp
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_EDX;
  uint uVar4;
  undefined1 auVar5 [12];
  error e;
  status_code_storage<system_error2::detail::erased<long,_true>_> local_90;
  long *local_80;
  undefined4 local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  code *local_18;
  
  local_90 = (status_code_storage<system_error2::detail::erased<long,_true>_>)open_resource();
  (**(local_90.super_status_code<void>._domain._domain)->_vptr_status_code_domain)
            (&local_40,local_90.super_status_code<void>._domain._domain);
  uVar1 = local_40;
  if (local_90.super_status_code<void>._domain == (status_code_domain *)0x0) {
    local_70 = "(empty)";
    local_68 = "";
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    local_48 = system_error2::status_code_domain::string_ref::_checking_string_thunk;
  }
  else {
    (*(local_90.super_status_code<void>._domain)->_vptr_status_code_domain[5])
              (&local_70,local_90.super_status_code<void>._domain,&local_90);
  }
  printf("Returned error has a code domain of \'%s\', a message of \'%s\'\n",uVar1,local_70);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_70,0,2);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_40,0,2);
  }
  local_80 = &system_error2::generic_code_domain;
  local_78 = 1;
  if (local_90.super_status_code<void>._domain == (status_code_domain *)0x0) {
    uVar4 = 0;
  }
  else {
    iVar3 = (*(local_90.super_status_code<void>._domain)->_vptr_status_code_domain[3])
                      (local_90.super_status_code<void>._domain,&local_90,&local_80);
    uVar4 = 1;
    if ((char)iVar3 == '\0') {
      cVar2 = (**(code **)(*local_80 + 0x18))(local_80,&local_80,&local_90);
      if (cVar2 == '\0') {
        auVar5 = (**(code **)(*local_80 + 0x20))();
        local_40 = auVar5._0_8_;
        uStack_38 = CONCAT44(uStack_38._4_4_,auVar5._8_4_);
        if (auVar5._8_4_ != -1) {
          iVar3 = (*(local_90.super_status_code<void>._domain)->_vptr_status_code_domain[3])
                            (local_90.super_status_code<void>._domain,&local_90,&local_40);
          if ((char)iVar3 != '\0') goto LAB_0010258e;
        }
        iVar3 = (*(local_90.super_status_code<void>._domain)->_vptr_status_code_domain[4])();
        local_70 = (char *)CONCAT44(extraout_var,iVar3);
        local_68 = (char *)CONCAT44(local_68._4_4_,extraout_EDX);
        if (extraout_EDX != -1) {
          cVar2 = (**(code **)(*local_80 + 0x18))(local_80,&local_80,&local_70);
          if (cVar2 != '\0') goto LAB_0010258e;
        }
        uVar4 = (uint)(local_80 == (long *)0x0 &&
                      local_90.super_status_code<void>._domain == (status_code_domain *)0x0);
      }
    }
  }
LAB_0010258e:
  printf("\nAnd semantically comparing it to \'errc::operation_not_permitted\' = %d\n",(ulong)uVar4)
  ;
  if (local_90.super_status_code<void>._domain != (status_code_domain *)0x0) {
    local_40 = 8;
    uStack_38 = 0x10;
    local_30 = 8;
    (*(local_90.super_status_code<void>._domain)->_vptr_status_code_domain[8])
              (local_90.super_status_code<void>._domain,&local_90);
  }
  return 0;
}

Assistant:

int main(void)
{
  error e = open_resource();
  // A quick demonstration that the indirection works as indicated
  printf("Returned error has a code domain of '%s', a message of '%s'\n", e.domain().name().c_str(), e.message().c_str());
  printf("\nAnd semantically comparing it to 'errc::operation_not_permitted' = %d\n", e == errc::operation_not_permitted);
}